

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall
Hospital::Password_Validate
          (Hospital *this,string *password,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  Hospital *this_00;
  string password_1;
  string local_b8 [2];
  undefined1 local_78 [48];
  vector<Nurse,_std::allocator<Nurse>_> local_48;
  
  pcVar1 = (password->_M_dataplus)._M_p;
  local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar1,pcVar1 + password->_M_string_length);
  std::vector<Nurse,_std::allocator<Nurse>_>::vector(&local_48,All_Of_Nurses);
  std::vector<Doctor,_std::allocator<Doctor>_>::vector
            ((vector<Doctor,_std::allocator<Doctor>_> *)(local_78 + 0x18),All_Of_Doctors);
  this_00 = (Hospital *)local_78;
  std::vector<Patient,_std::allocator<Patient>_>::vector
            ((vector<Patient,_std::allocator<Patient>_> *)this_00,All_Of_Patients);
  bVar2 = Existence_Of_Password
                    (this_00,local_b8,&local_48,
                     (vector<Doctor,_std::allocator<Doctor>_> *)(local_78 + 0x18),
                     (vector<Patient,_std::allocator<Patient>_> *)local_78);
  std::vector<Patient,_std::allocator<Patient>_>::~vector
            ((vector<Patient,_std::allocator<Patient>_> *)local_78);
  std::vector<Doctor,_std::allocator<Doctor>_>::~vector
            ((vector<Doctor,_std::allocator<Doctor>_> *)(local_78 + 0x18));
  std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
    operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"This password already exists !!!",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return false;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  pcVar1 = (password->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar3,pcVar1,pcVar1 + password->_M_string_length);
  __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool Hospital :: Password_Validate(string password , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients) {
    try {
        if (Existence_Of_Password (password,All_Of_Nurses , All_Of_Doctors ,All_Of_Patients )) {
            cout << "This password already exists !!!"<<endl;   ///add bool func to search in file and check existence of user_name
            return false;
        }
        else throw password;
    }
    catch(string password) {
        cout << "your password  entered successfully ."<<endl;
        return true;
    }
}